

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O1

ssize_t __thiscall
LinkedReadsDatastore::write(LinkedReadsDatastore *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  void *__buf_00;
  undefined4 in_register_00000034;
  char *pcVar2;
  uint64_t count;
  size_type local_20;
  
  pcVar2 = (char *)CONCAT44(in_register_00000034,__fd);
  local_20 = (this->filename)._M_string_length;
  std::ostream::write(pcVar2,(long)&local_20);
  std::ostream::write(pcVar2,(long)(this->filename)._M_dataplus._M_p);
  local_20 = (this->name)._M_string_length;
  std::ostream::write(pcVar2,(long)&local_20);
  std::ostream::write(pcVar2,(long)(this->name)._M_dataplus._M_p);
  sVar1 = LinkedReadsMapper::write(&this->mapper,__fd,__buf_00,__n);
  return sVar1;
}

Assistant:

void LinkedReadsDatastore::write(std::ofstream &output_file) {
    //read filename
    sdglib::write_string(output_file, filename);
    sdglib::write_string(output_file, name);

    mapper.write(output_file);
}